

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBarBuf.c
# Opt level: O0

int Abc_NtkCollectPiPos_rec(Abc_Obj_t *pNet,Vec_Ptr_t *vLiMaps,Vec_Ptr_t *vLoMaps)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  Abc_Ntk_t *pNtk;
  int local_40;
  int local_3c;
  int Counter;
  int i;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *vLoMaps_local;
  Vec_Ptr_t *vLiMaps_local;
  Abc_Obj_t *pNet_local;
  
  local_40 = 0;
  iVar1 = Abc_ObjIsNet(pNet);
  if (iVar1 == 0) {
    __assert_fail("Abc_ObjIsNet(pNet)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBarBuf.c"
                  ,0x61,"int Abc_NtkCollectPiPos_rec(Abc_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
  }
  iVar1 = Abc_NodeIsTravIdCurrent(pNet);
  if (iVar1 == 0) {
    Abc_NodeSetTravIdCurrent(pNet);
    pFanin = Abc_ObjFanin0(pNet);
    iVar1 = Abc_ObjIsNode(pFanin);
    if (iVar1 != 0) {
      for (local_3c = 0; iVar1 = Abc_ObjFaninNum(pFanin), local_3c < iVar1; local_3c = local_3c + 1)
      {
        pAVar2 = Abc_ObjFanin(pFanin,local_3c);
        iVar1 = Abc_NtkCollectPiPos_rec(pAVar2,vLiMaps,vLoMaps);
        local_40 = iVar1 + local_40;
      }
    }
    iVar1 = Abc_ObjIsNode(pFanin);
    if (iVar1 == 0) {
      iVar1 = Abc_ObjIsBo(pFanin);
      if (iVar1 != 0) {
        pFanin = Abc_ObjFanin0(pFanin);
      }
      iVar1 = Abc_ObjIsBox(pFanin);
      if (iVar1 == 0) {
        __assert_fail("Abc_ObjIsBox(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcBarBuf.c"
                      ,0x6d,"int Abc_NtkCollectPiPos_rec(Abc_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
      }
      for (local_3c = 0; iVar1 = Abc_ObjFanoutNum(pFanin), local_3c < iVar1; local_3c = local_3c + 1
          ) {
        pAVar2 = Abc_ObjFanout(pFanin,local_3c);
        pAVar2 = Abc_ObjFanout0(pAVar2);
        Abc_NodeSetTravIdCurrent(pAVar2);
      }
      for (local_3c = 0; iVar1 = Abc_ObjFaninNum(pFanin), local_3c < iVar1; local_3c = local_3c + 1)
      {
        pAVar2 = Abc_ObjFanin(pFanin,local_3c);
        pAVar2 = Abc_ObjFanin0(pAVar2);
        iVar1 = Abc_NtkCollectPiPos_rec(pAVar2,vLiMaps,vLoMaps);
        local_40 = iVar1 + local_40;
      }
      pNtk = Abc_ObjModel(pFanin);
      iVar1 = Abc_NtkCollectPiPos_int(pFanin,pNtk,vLiMaps,vLoMaps);
      pNet_local._4_4_ = iVar1 + local_40;
    }
    else {
      pNet_local._4_4_ = local_40;
    }
  }
  else {
    pNet_local._4_4_ = 0;
  }
  return pNet_local._4_4_;
}

Assistant:

int Abc_NtkCollectPiPos_rec( Abc_Obj_t * pNet, Vec_Ptr_t * vLiMaps, Vec_Ptr_t * vLoMaps )
{
    extern int Abc_NtkCollectPiPos_int( Abc_Obj_t * pBox, Abc_Ntk_t * pNtk, Vec_Ptr_t * vLiMaps, Vec_Ptr_t * vLoMaps );
    Abc_Obj_t * pObj, * pFanin; 
    int i, Counter = 0;
    assert( Abc_ObjIsNet(pNet) );
    if ( Abc_NodeIsTravIdCurrent( pNet ) )
        return 0;
    Abc_NodeSetTravIdCurrent( pNet );
    pObj = Abc_ObjFanin0(pNet);
    if ( Abc_ObjIsNode(pObj) )
        Abc_ObjForEachFanin( pObj, pFanin, i )
            Counter += Abc_NtkCollectPiPos_rec( pFanin, vLiMaps, vLoMaps );
    if ( Abc_ObjIsNode(pObj) )
        return Counter;
    if ( Abc_ObjIsBo(pObj) )
        pObj = Abc_ObjFanin0(pObj);
    assert( Abc_ObjIsBox(pObj) );
    Abc_ObjForEachFanout( pObj, pFanin, i )
        Abc_NodeSetTravIdCurrent( Abc_ObjFanout0(pFanin) );
    Abc_ObjForEachFanin( pObj, pFanin, i )
        Counter += Abc_NtkCollectPiPos_rec( Abc_ObjFanin0(pFanin), vLiMaps, vLoMaps );
    Counter += Abc_NtkCollectPiPos_int( pObj, Abc_ObjModel(pObj), vLiMaps, vLoMaps );
    return Counter;
}